

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

int WebPEncode(WebPConfig *config,WebPPicture *pic)

{
  int iVar1;
  uint uVar2;
  VP8Encoder *pVVar3;
  WebPPicture *in_RSI;
  WebPConfig *in_RDI;
  bool bVar4;
  bool bVar5;
  float x2;
  float x;
  float dithering;
  VP8Encoder *enc;
  WebPConfig *in_stack_00000028;
  int ok;
  WebPPicture *in_stack_00000040;
  WebPConfig *in_stack_00000048;
  VP8Encoder *in_stack_00001248;
  VP8Encoder *in_stack_000012b8;
  VP8Encoder *in_stack_00002678;
  float in_stack_ffffffffffffffb8;
  WebPEncCSP in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar6;
  uint local_1c;
  uint local_4;
  
  if (in_RSI == (WebPPicture *)0x0) {
    local_4 = 0;
  }
  else {
    in_RSI->error_code = VP8_ENC_OK;
    if (in_RDI == (WebPConfig *)0x0) {
      local_4 = WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_NULL_PARAMETER);
    }
    else {
      iVar1 = WebPValidateConfig(in_RDI);
      if (iVar1 == 0) {
        local_4 = WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_INVALID_CONFIGURATION);
      }
      else {
        iVar1 = WebPValidatePicture((WebPPicture *)
                                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else if ((in_RSI->width < 0x4000) && (in_RSI->height < 0x4000)) {
          if (in_RSI->stats != (WebPAuxStats *)0x0) {
            memset(in_RSI->stats,0,0xbc);
          }
          if (in_RDI->lossless == 0) {
            if ((((in_RSI->use_argb != 0) || (in_RSI->y == (uint8_t *)0x0)) ||
                (in_RSI->u == (uint8_t *)0x0)) || (in_RSI->v == (uint8_t *)0x0)) {
              if ((in_RDI->use_sharp_yuv == 0) && ((in_RDI->preprocessing & 4U) == 0)) {
                iVar1 = WebPPictureARGBToYUVADithered
                                  ((WebPPicture *)
                                   CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
                if (iVar1 == 0) {
                  return 0;
                }
              }
              else {
                iVar1 = WebPPictureSharpARGBToYUVA((WebPPicture *)0x18a346);
                if (iVar1 == 0) {
                  return 0;
                }
              }
            }
            if (in_RDI->exact == 0) {
              WebPCleanupTransparentArea((WebPPicture *)enc);
            }
            pVVar3 = InitVP8Encoder(in_stack_00000048,in_stack_00000040);
            if (pVVar3 == (VP8Encoder *)0x0) {
              return 0;
            }
            iVar1 = VP8EncAnalyze(in_stack_00002678);
            bVar4 = false;
            if (iVar1 != 0) {
              iVar1 = VP8EncStartAlpha((VP8Encoder *)
                                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                      );
              bVar4 = iVar1 != 0;
            }
            if (pVVar3->use_tokens == 0) {
              bVar5 = false;
              if (bVar4) {
                iVar1 = VP8EncLoop(in_stack_00001248);
                bVar5 = iVar1 != 0;
              }
            }
            else {
              bVar5 = false;
              if (bVar4) {
                iVar1 = VP8EncTokenLoop(in_stack_000012b8);
                bVar5 = iVar1 != 0;
              }
            }
            bVar4 = false;
            if (bVar5) {
              iVar1 = VP8EncFinishAlpha((VP8Encoder *)
                                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ));
              bVar4 = iVar1 != 0;
            }
            uVar6 = false;
            if (bVar4) {
              iVar1 = VP8EncWrite(_x);
              uVar6 = iVar1 != 0;
            }
            uVar2 = (uint)(byte)uVar6;
            StoreStats((VP8Encoder *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
            if (uVar2 == 0) {
              VP8EncFreeBitWriters((VP8Encoder *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
            }
            local_1c = DeleteVP8Encoder((VP8Encoder *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
            local_1c = local_1c & uVar2;
          }
          else {
            if ((in_RSI->argb == (uint32_t *)0x0) &&
               (iVar1 = WebPPictureYUVAToARGB(pic), iVar1 == 0)) {
              return 0;
            }
            if (in_RDI->exact == 0) {
              WebPReplaceTransparentPixels
                        ((WebPPicture *)
                         CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
            }
            local_1c = VP8LEncodeImage(in_stack_00000028,(WebPPicture *)enc);
          }
          local_4 = local_1c;
        }
        else {
          local_4 = WebPEncodingSetError(in_RSI,VP8_ENC_ERROR_BAD_DIMENSION);
        }
      }
    }
  }
  return local_4;
}

Assistant:

int WebPEncode(const WebPConfig* config, WebPPicture* pic) {
  int ok = 0;
  if (pic == NULL) return 0;

  pic->error_code = VP8_ENC_OK;  // all ok so far
  if (config == NULL) {  // bad params
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if (!WebPValidateConfig(config)) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  if (!WebPValidatePicture(pic)) return 0;
  if (pic->width > WEBP_MAX_DIMENSION || pic->height > WEBP_MAX_DIMENSION) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_DIMENSION);
  }

  if (pic->stats != NULL) memset(pic->stats, 0, sizeof(*pic->stats));

  if (!config->lossless) {
    VP8Encoder* enc = NULL;

    if (pic->use_argb || pic->y == NULL || pic->u == NULL || pic->v == NULL) {
      // Make sure we have YUVA samples.
      if (config->use_sharp_yuv || (config->preprocessing & 4)) {
        if (!WebPPictureSharpARGBToYUVA(pic)) {
          return 0;
        }
      } else {
        float dithering = 0.f;
        if (config->preprocessing & 2) {
          const float x = config->quality / 100.f;
          const float x2 = x * x;
          // slowly decreasing from max dithering at low quality (q->0)
          // to 0.5 dithering amplitude at high quality (q->100)
          dithering = 1.0f + (0.5f - 1.0f) * x2 * x2;
        }
        if (!WebPPictureARGBToYUVADithered(pic, WEBP_YUV420, dithering)) {
          return 0;
        }
      }
    }

    if (!config->exact) {
      WebPCleanupTransparentArea(pic);
    }

    enc = InitVP8Encoder(config, pic);
    if (enc == NULL) return 0;  // pic->error is already set.
    // Note: each of the tasks below account for 20% in the progress report.
    ok = VP8EncAnalyze(enc);

    // Analysis is done, proceed to actual coding.
    ok = ok && VP8EncStartAlpha(enc);   // possibly done in parallel
    if (!enc->use_tokens) {
      ok = ok && VP8EncLoop(enc);
    } else {
      ok = ok && VP8EncTokenLoop(enc);
    }
    ok = ok && VP8EncFinishAlpha(enc);

    ok = ok && VP8EncWrite(enc);
    StoreStats(enc);
    if (!ok) {
      VP8EncFreeBitWriters(enc);
    }
    ok &= DeleteVP8Encoder(enc);  // must always be called, even if !ok
  } else {
    // Make sure we have ARGB samples.
    if (pic->argb == NULL && !WebPPictureYUVAToARGB(pic)) {
      return 0;
    }

    if (!config->exact) {
      WebPReplaceTransparentPixels(pic, 0x000000);
    }

    ok = VP8LEncodeImage(config, pic);  // Sets pic->error in case of problem.
  }

  return ok;
}